

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O1

Sequence * __thiscall
Sequence::operator*(Sequence *__return_storage_ptr__,Sequence *this,Sequence *t_seq)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  _Map_pointer ppiVar4;
  _Map_pointer ppiVar5;
  _Elt_pointer piVar6;
  long lVar7;
  uint *puVar8;
  int i;
  size_type __n;
  ulong uVar9;
  long lVar10;
  
  ppiVar4 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  Sequence(__return_storage_ptr__,
           (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_start._M_last -
                        (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_start._M_cur) >> 2) +
           (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) >> 2) +
           ((((uint)((int)ppiVar4 -
                    *(int *)&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (uint)(ppiVar4 == (_Map_pointer)0x0)) * 0x80);
  ppiVar4 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppiVar5 = (t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if ((int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_last -
                   (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur) >> 2) +
      (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur -
                   (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_first) >> 2) +
      ((((uint)((int)ppiVar4 -
               *(int *)&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (uint)(ppiVar4 == (_Map_pointer)0x0)) * 0x80 ==
      (int)((ulong)((long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_last -
                   (long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur) >> 2) +
      (int)((ulong)((long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur -
                   (long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_first) >> 2) +
      ((((uint)((int)ppiVar5 -
               *(int *)&(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (uint)(ppiVar5 == (_Map_pointer)0x0)) * 0x80) {
    lVar10 = 0;
    for (__n = 0; ppiVar4 = (t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node,
        (long)__n <
        (long)(int)((int)((ulong)((long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                                 (long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Deque_impl_data._M_start._M_cur) >> 2) +
                    (int)((ulong)((long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Deque_impl_data._M_finish._M_first) >> 2) +
                   ((((uint)((int)ppiVar4 -
                            *(int *)&(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (uint)(ppiVar4 == (_Map_pointer)0x0)) * 0x80); __n = __n + 1) {
      piVar6 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      lVar7 = (long)piVar6 -
              (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 2;
      uVar1 = lVar7 + __n;
      if (uVar1 < 0x80) {
        puVar8 = (uint *)((long)piVar6 + lVar10);
      }
      else {
        uVar9 = (uVar1 >> 7) + 0xfe00000000000000;
        if (0 < (long)uVar1) {
          uVar9 = uVar1 >> 7;
        }
        puVar8 = (uint *)((this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar9] +
                         lVar7 + uVar9 * -0x80 + __n);
      }
      uVar2 = *puVar8;
      puVar8 = (uint *)std::deque<int,_std::allocator<int>_>::at(&t_seq->m_bits,__n);
      uVar3 = *puVar8;
      puVar8 = (uint *)std::deque<int,_std::allocator<int>_>::at
                                 (&__return_storage_ptr__->m_bits,__n);
      *puVar8 = uVar3 ^ uVar2;
      lVar10 = lVar10 + 4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::operator*(Sequence t_seq) {
    Sequence res(size());
    if (size() != t_seq.size()) {
        return res;
    }
    for (auto i = 0; i < t_seq.size(); ++i) {
        res[i] = m_bits[i] ^ t_seq[i];
    }
    return res;
}